

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

void __thiscall
DnsStats::ExportDnssecUsageByTable
          (DnsStats *this,BinHash<DnssecPrefixEntry> *dnssecTable,uint32_t registry_id)

{
  uint64_t count;
  uint uVar1;
  ulong uVar2;
  DnssecPrefixEntry *pDVar3;
  uint64_t count_00;
  
  count_00 = 0;
  if ((ulong)dnssecTable->tableSize == 0) {
    count = 0;
  }
  else {
    uVar2 = 0;
    uVar1 = 0;
    count = count_00;
    do {
      for (pDVar3 = dnssecTable->hashBin[uVar2]; pDVar3 != (DnssecPrefixEntry *)0x0;
          pDVar3 = pDVar3->HashNext) {
        uVar1 = uVar1 + pDVar3->is_dnssec;
        count = (uint64_t)((int)count + (pDVar3->is_dnssec ^ 1));
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != dnssecTable->tableSize);
    count_00 = (uint64_t)uVar1;
  }
  SubmitRegistryNumberAndCount(this,registry_id,0,count);
  SubmitRegistryNumberAndCount(this,registry_id,1,count_00);
  return;
}

Assistant:

void DnsStats::ExportDnssecUsageByTable(BinHash<DnssecPrefixEntry>* dnssecTable, uint32_t registry_id)
{
    DnssecPrefixEntry *dpe;
    uint32_t usage_count = 0;
    uint32_t nonusage_count = 0;

    for (uint32_t i = 0; i < dnssecTable->GetSize(); i++)
    {
        dpe = dnssecTable->GetEntry(i);

        while (dpe != NULL)
        {
            if (dpe->is_dnssec) {
                usage_count++;
            } else {
                nonusage_count++;
            }
            dpe = dpe->HashNext;
        }
    }
    
    SubmitRegistryNumberAndCount(registry_id, 0, nonusage_count);
    SubmitRegistryNumberAndCount(registry_id, 1, usage_count);
}